

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::InitializeFromCommand(cmCTest *this,cmCTestStartCommand *command)

{
  bool bVar1;
  int iVar2;
  cmMakefile *this_00;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_a60 [32];
  string local_a40;
  string local_a20;
  undefined1 local_a00 [8];
  ostringstream cmCTestLog_msg_4;
  allocator local_881;
  string local_880;
  string local_860 [32];
  undefined1 local_840 [8];
  ostringstream cmCTestLog_msg_3;
  allocator local_6c1;
  string local_6c0;
  char *local_6a0;
  char *dartVersion;
  string local_690;
  allocator local_669;
  string local_668;
  allocator local_641;
  string local_640;
  string local_620 [32];
  undefined1 local_600 [8];
  ostringstream cmCTestLog_msg_2;
  string local_488 [32];
  undefined1 local_468 [8];
  ostringstream cmCTestLog_msg_1;
  allocator local_2e9;
  undefined1 local_2e8 [8];
  string m;
  string local_2c0 [7];
  bool readit;
  undefined1 local_2a0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_128 [8];
  string bld_dir_fname;
  string src_dir_fname;
  string fname;
  cmMakefile *mf;
  Part p;
  undefined1 local_98 [8];
  string bld_dir;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string src_dir;
  cmCTestStartCommand *command_local;
  cmCTest *this_local;
  
  src_dir.field_2._8_8_ = command;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"SourceDirectory",&local_61);
  GetCTestConfiguration((string *)local_40,this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&p,"BuildDirectory",(allocator *)((long)&mf + 7));
  GetCTestConfiguration((string *)local_98,this,(string *)&p);
  std::__cxx11::string::~string((string *)&p);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  for (mf._0_4_ = 0; (uint)mf != 0xb; mf._0_4_ = (uint)mf + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Parts[(uint)mf].SubmitFiles);
  }
  this_00 = cmCommand::GetMakefile((cmCommand *)src_dir.field_2._8_8_);
  std::__cxx11::string::string((string *)(src_dir_fname.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(bld_dir_fname.field_2._M_local_buf + 8),(string *)local_40);
  std::__cxx11::string::operator+=
            ((string *)(bld_dir_fname.field_2._M_local_buf + 8),"/CTestConfig.cmake");
  cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&bld_dir_fname.field_2 + 8));
  std::__cxx11::string::string((string *)local_128,(string *)local_98);
  std::__cxx11::string::operator+=((string *)local_128,"/CTestConfig.cmake");
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_128);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar3);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)(src_dir_fname.field_2._M_local_buf + 8),(string *)local_128);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(src_dir_fname.field_2._M_local_buf + 8),
                 (string *)(bld_dir_fname.field_2._M_local_buf + 8));
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    poVar5 = std::operator<<((ostream *)local_2a0,"   Reading ctest configuration file: ");
    poVar5 = std::operator<<(poVar5,(string *)(src_dir_fname.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2b8,pcVar3,bVar1);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    m.field_2._M_local_buf[0xf] = cmMakefile::ReadDependentFile(this_00,pcVar3,true);
    if (!(bool)m.field_2._M_local_buf[0xf]) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2e8,"Could not find include file: ",&local_2e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::operator+=
                ((string *)local_2e8,(string *)(src_dir_fname.field_2._M_local_buf + 8));
      cmCommand::SetError((cmCommand *)src_dir.field_2._8_8_,(string *)local_2e8);
      this_local._7_1_ = false;
      std::__cxx11::string::~string((string *)local_2e8);
      goto LAB_004beeb5;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    poVar5 = std::operator<<((ostream *)local_468,
                             "Cannot locate CTest configuration: in BuildDirectory: ");
    poVar5 = std::operator<<(poVar5,(string *)local_128);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2c6,pcVar3,bVar1);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_600);
    poVar5 = std::operator<<((ostream *)local_600,
                             "Cannot locate CTest configuration: in SourceDirectory: ");
    poVar5 = std::operator<<(poVar5,(string *)(bld_dir_fname.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2c9,pcVar3,bVar1);
    std::__cxx11::string::~string(local_620);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_600);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"CTEST_NIGHTLY_START_TIME",&local_641);
  bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
  SetCTestConfigurationFromCMakeVariable(this,this_00,"NightlyStartTime",&local_640,bVar1);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_668,"CTEST_SITE",&local_669);
  bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
  SetCTestConfigurationFromCMakeVariable(this,this_00,"Site",&local_668,bVar1);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_690,"CTEST_BUILD_NAME",(allocator *)((long)&dartVersion + 7));
  bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
  SetCTestConfigurationFromCMakeVariable(this,this_00,"BuildName",&local_690,bVar1);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dartVersion + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"CTEST_DART_SERVER_VERSION",&local_6c1);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  local_6a0 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    iVar2 = atoi(pcVar3);
    this->DartVersion = iVar2;
    if (this->DartVersion < 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
      poVar5 = std::operator<<((ostream *)local_840,"Invalid Dart server version: ");
      poVar5 = std::operator<<(poVar5,local_6a0);
      poVar5 = std::operator<<(poVar5,". Please specify the version number.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x2da,pcVar3,false);
      std::__cxx11::string::~string(local_860);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
      this_local._7_1_ = false;
      goto LAB_004beeb5;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_880,"CTEST_DROP_SITE_CDASH",&local_881);
  bVar1 = cmMakefile::IsOn(this_00,&local_880);
  this->DropSiteCDash = bVar1;
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = Initialize(this,pcVar3,(cmCTestStartCommand *)src_dir.field_2._8_8_);
  if (iVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
    poVar5 = std::operator<<((ostream *)local_a00,"   Use ");
    GetTestModelString_abi_cxx11_(&local_a20,this);
    poVar5 = std::operator<<(poVar5,(string *)&local_a20);
    poVar5 = std::operator<<(poVar5," tag: ");
    GetCurrentTag_abi_cxx11_(&local_a40,this);
    poVar5 = std::operator<<(poVar5,(string *)&local_a40);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmCTestStartCommand::ShouldBeQuiet((cmCTestStartCommand *)src_dir.field_2._8_8_);
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x2e6,pcVar3,bVar1);
    std::__cxx11::string::~string(local_a60);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
    this_local._7_1_ = true;
  }
LAB_004beeb5:
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(bld_dir_fname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(src_dir_fname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmCTest::InitializeFromCommand(cmCTestStartCommand* command)
{
  std::string src_dir
    = this->GetCTestConfiguration("SourceDirectory");
  std::string bld_dir = this->GetCTestConfiguration("BuildDirectory");
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  for(Part p = PartStart; p != PartCount; p = Part(p+1))
    {
    this->Parts[p].SubmitFiles.clear();
    }

  cmMakefile* mf = command->GetMakefile();
  std::string fname;

  std::string src_dir_fname = src_dir;
  src_dir_fname += "/CTestConfig.cmake";
  cmSystemTools::ConvertToUnixSlashes(src_dir_fname);

  std::string bld_dir_fname = bld_dir;
  bld_dir_fname += "/CTestConfig.cmake";
  cmSystemTools::ConvertToUnixSlashes(bld_dir_fname);

  if ( cmSystemTools::FileExists(bld_dir_fname.c_str()) )
    {
    fname = bld_dir_fname;
    }
  else if ( cmSystemTools::FileExists(src_dir_fname.c_str()) )
    {
    fname = src_dir_fname;
    }

  if ( !fname.empty() )
    {
    cmCTestOptionalLog(this, OUTPUT, "   Reading ctest configuration file: "
      << fname << std::endl, command->ShouldBeQuiet());
    bool readit = mf->ReadDependentFile(fname.c_str());
    if(!readit)
      {
      std::string m = "Could not find include file: ";
      m += fname;
      command->SetError(m);
      return false;
      }
    }
  else
    {
    cmCTestOptionalLog(this, WARNING,
      "Cannot locate CTest configuration: in BuildDirectory: "
      << bld_dir_fname << std::endl, command->ShouldBeQuiet());
    cmCTestOptionalLog(this, WARNING,
      "Cannot locate CTest configuration: in SourceDirectory: "
      << src_dir_fname << std::endl, command->ShouldBeQuiet());
    }

  this->SetCTestConfigurationFromCMakeVariable(mf, "NightlyStartTime",
    "CTEST_NIGHTLY_START_TIME", command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "Site", "CTEST_SITE",
    command->ShouldBeQuiet());
  this->SetCTestConfigurationFromCMakeVariable(mf, "BuildName",
    "CTEST_BUILD_NAME", command->ShouldBeQuiet());
  const char* dartVersion = mf->GetDefinition("CTEST_DART_SERVER_VERSION");
  if ( dartVersion )
    {
    this->DartVersion = atoi(dartVersion);
    if ( this->DartVersion < 0 )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Invalid Dart server version: "
        << dartVersion << ". Please specify the version number."
        << std::endl);
      return false;
      }
    }
  this->DropSiteCDash = mf->IsOn("CTEST_DROP_SITE_CDASH");

  if ( !this->Initialize(bld_dir.c_str(), command) )
    {
    return false;
    }
  cmCTestOptionalLog(this, OUTPUT, "   Use " << this->GetTestModelString()
    << " tag: " << this->GetCurrentTag() << std::endl,
    command->ShouldBeQuiet());
  return true;
}